

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall
cmFileAPI::BuildCache(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  Value *pVVar1;
  Value VStack_68;
  Value local_40;
  
  cmFileAPICacheDump(__return_storage_ptr__,this,object->Version);
  Json::Value::Value(&local_40,ObjectKindName::objectKindNames[(int)object->Kind]);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"kind");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  if (object->Version == 2) {
    BuildVersion(&VStack_68,2,0);
    Json::Value::operator=(pVVar1,&VStack_68);
    Json::Value::~Value(&VStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCache(Object const& object)
{
  using namespace std::placeholders;
  Json::Value cache = cmFileAPICacheDump(*this, object.Version);
  cache["kind"] = this->ObjectKindName(object.Kind);

  Json::Value& version = cache["version"];
  if (object.Version == 2) {
    version = BuildVersion(2, CacheV2Minor);
  } else {
    return cache; // should be unreachable
  }

  return cache;
}